

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_req.cc
# Opt level: O0

int rinf_cb(int operation,ASN1_VALUE **pval,ASN1_ITEM *it,void *exarg)

{
  ASN1_VALUE *pAVar1;
  stack_st_X509_ATTRIBUTE *psVar2;
  long lVar3;
  long version;
  X509_REQ_INFO *rinf;
  void *exarg_local;
  ASN1_ITEM *it_local;
  ASN1_VALUE **pval_local;
  int operation_local;
  
  pAVar1 = *pval;
  if (operation == 1) {
    psVar2 = sk_X509_ATTRIBUTE_new_null();
    *(stack_st_X509_ATTRIBUTE **)(pAVar1 + 0x30) = psVar2;
    if (*(long *)(pAVar1 + 0x30) == 0) {
      return 0;
    }
  }
  if (((operation == 5) && (lVar3 = ASN1_INTEGER_get(*(ASN1_INTEGER **)(pAVar1 + 0x18)), lVar3 != 0)
      ) && (lVar3 != 2)) {
    ERR_put_error(0xb,0,0x8c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_req.cc"
                  ,0x30);
    pval_local._4_4_ = 0;
  }
  else {
    pval_local._4_4_ = 1;
  }
  return pval_local._4_4_;
}

Assistant:

static int rinf_cb(int operation, ASN1_VALUE **pval, const ASN1_ITEM *it,
                   void *exarg) {
  X509_REQ_INFO *rinf = (X509_REQ_INFO *)*pval;

  if (operation == ASN1_OP_NEW_POST) {
    rinf->attributes = sk_X509_ATTRIBUTE_new_null();
    if (!rinf->attributes) {
      return 0;
    }
  }

  if (operation == ASN1_OP_D2I_POST) {
    // The only defined CSR version is v1(0). For compatibility, we also accept
    // a hypothetical v3(2). Although not defined, older versions of certbot
    // use it. See https://github.com/certbot/certbot/pull/9334.
    long version = ASN1_INTEGER_get(rinf->version);
    if (version != X509_REQ_VERSION_1 && version != 2) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_VERSION);
      return 0;
    }
  }

  return 1;
}